

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandCone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Wlc_Ntk_t *pWVar4;
  char *pcVar5;
  char *pName;
  int fVerbose;
  int fSeq;
  int fAllPis;
  int Range;
  int iOutput;
  int c;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pWVar4 = Wlc_AbcGetNtk(pAbc);
  fAllPis = -1;
  fSeq = 1;
  fVerbose = 0;
  pName._4_4_ = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_003e4f4a:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"ORisvh");
    if (iVar2 == -1) {
      if (pWVar4 == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
        return 0;
      }
      if ((-1 < fAllPis) && (iVar2 = Wlc_NtkCoNum(pWVar4), fAllPis < iVar2)) {
        pcVar5 = "combinational";
        if (pName._4_4_ != 0) {
          pcVar5 = "sequential";
        }
        printf("Extracting output %d as a %s word-level network.\n",(ulong)(uint)fAllPis,pcVar5);
        pcVar5 = Wlc_NtkNewName(pWVar4,fAllPis,pName._4_4_);
        Wlc_NtkMarkCone(pWVar4,fAllPis,fSeq,pName._4_4_,fVerbose);
        pWVar4 = Wlc_NtkDupDfs(pWVar4,1,pName._4_4_);
        if (pWVar4->pName != (char *)0x0) {
          free(pWVar4->pName);
          pWVar4->pName = (char *)0x0;
        }
        pcVar5 = Abc_UtilStrsav(pcVar5);
        pWVar4->pName = pcVar5;
        Wlc_AbcUpdateNtk(pAbc,pWVar4);
        return 0;
      }
      uVar3 = Wlc_NtkCoNum(pWVar4);
      Abc_Print(1,"Abc_CommandCone(): Illegal output index (%d) (should be 0 <= num < %d).\n",
                (ulong)(uint)fAllPis,(ulong)uVar3);
      return 0;
    }
    switch(iVar2) {
    case 0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_003e51b8;
      }
      fAllPis = atoi(argv[globalUtilOptind]);
      iVar2 = fAllPis;
      break;
    default:
      goto LAB_003e51b8;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_003e51b8;
      }
      fSeq = atoi(argv[globalUtilOptind]);
      iVar2 = fSeq;
      break;
    case 0x68:
      goto LAB_003e51b8;
    case 0x69:
      fVerbose = fVerbose ^ 1;
      goto LAB_003e4f4a;
    case 0x73:
      pName._4_4_ = pName._4_4_ ^ 1;
      goto LAB_003e4f4a;
    case 0x76:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_003e4f4a;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_003e51b8:
      Abc_Print(-2,"usage: %%cone [-OR num] [-isvh]\n");
      Abc_Print(-2,"\t         extracts logic cone of one or more word-level outputs\n");
      Abc_Print(-2,
                "\t-O num : zero-based index of the first word-level output to extract [default = %d]\n"
                ,(ulong)(uint)fAllPis);
      Abc_Print(-2,"\t-R num : total number of word-level outputs to extract [default = %d]\n",
                (ulong)(uint)fSeq);
      pcVar5 = "no";
      if (fVerbose != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggle using support composed of all primary inputs [default = %s]\n"
                ,pcVar5);
      pcVar5 = "no";
      if (pName._4_4_ != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle performing extracting sequential cones [default = %s]\n",
                pcVar5);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, iOutput = -1, Range = 1, fAllPis = 0, fSeq = 0, fVerbose  = 0;
    char * pName;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORisvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutput < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            Range = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Range < 0 )
                goto usage;
            break;
        case 'i':
            fAllPis ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    if ( iOutput < 0 || iOutput >= Wlc_NtkCoNum(pNtk) )
    {
        Abc_Print( 1, "Abc_CommandCone(): Illegal output index (%d) (should be 0 <= num < %d).\n", iOutput, Wlc_NtkCoNum(pNtk) );
        return 0;
    }
    printf( "Extracting output %d as a %s word-level network.\n", iOutput, fSeq ? "sequential" : "combinational" );
    pName = Wlc_NtkNewName( pNtk, iOutput, fSeq );
    Wlc_NtkMarkCone( pNtk, iOutput, Range, fSeq, fAllPis );
    pNtk = Wlc_NtkDupDfs( pNtk, 1, fSeq );
    ABC_FREE( pNtk->pName );
    pNtk->pName = Abc_UtilStrsav( pName );
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%cone [-OR num] [-isvh]\n" );
    Abc_Print( -2, "\t         extracts logic cone of one or more word-level outputs\n" );
    Abc_Print( -2, "\t-O num : zero-based index of the first word-level output to extract [default = %d]\n", iOutput );
    Abc_Print( -2, "\t-R num : total number of word-level outputs to extract [default = %d]\n", Range );
    Abc_Print( -2, "\t-i     : toggle using support composed of all primary inputs [default = %s]\n", fAllPis? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle performing extracting sequential cones [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}